

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_align_search.c
# Opt level: O2

ps_seg_t * state_align_search_seg_next(ps_seg_t *seg)

{
  ps_alignment_iter_t *ppVar1;
  
  ppVar1 = ps_alignment_iter_next((ps_alignment_iter_t *)seg[1].vt);
  seg[1].vt = (ps_segfuncs_t *)ppVar1;
  if (ppVar1 == (ps_alignment_iter_t *)0x0) {
    state_align_search_seg_free(seg);
    seg = (ps_seg_t *)0x0;
  }
  else {
    state_align_search_fill_iter(seg);
  }
  return seg;
}

Assistant:

static ps_seg_t *
state_align_search_seg_next(ps_seg_t * seg)
{
    state_align_seg_t *itor = (state_align_seg_t *)seg;

    itor->itor = ps_alignment_iter_next(itor->itor);
    if (itor->itor == NULL) {
        state_align_search_seg_free(seg);
        return NULL;
    }
    state_align_search_fill_iter(seg);
    return seg;
}